

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIImage::setImage(CGUIImage *this,ITexture *image)

{
  code *pcVar1;
  ITexture *pIVar2;
  _func_int *p_Var3;
  
  pIVar2 = this->Texture;
  if (pIVar2 != image) {
    if (pIVar2 != (ITexture *)0x0) {
      p_Var3 = pIVar2->_vptr_ITexture[-3];
      pcVar1 = p_Var3 + 8 + (long)&(pIVar2->NamedPath).Path;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar2->_vptr_ITexture + (long)p_Var3) + 8))();
      }
    }
    this->Texture = image;
    if (image != (ITexture *)0x0) {
      *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) =
           *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) + 1;
    }
  }
  return;
}

Assistant:

void CGUIImage::setImage(video::ITexture *image)
{
	if (image == Texture)
		return;

	if (Texture)
		Texture->drop();

	Texture = image;

	if (Texture)
		Texture->grab();
}